

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.cpp
# Opt level: O1

bool __thiscall
Sonne::Counter::_CompareStringToBuffer
          (Counter *this,vector<char,_std::allocator<char>_> *buffer,string *compare,size_t *start)

{
  size_t sVar1;
  pointer pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  
  sVar1 = *start;
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar3 = (compare->_M_dataplus)._M_p;
  if (pcVar2[sVar1] == *pcVar3) {
    uVar4 = compare->_M_string_length;
    bVar7 = uVar4 < 2;
    if (!bVar7) {
      uVar5 = 1;
      do {
        if (sVar1 + uVar5 <
            (ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar2)) {
          cVar6 = pcVar2[uVar5 + sVar1];
        }
        else {
          cVar6 = '\0';
        }
        if (cVar6 != pcVar3[uVar5]) {
          return bVar7;
        }
        uVar5 = uVar5 + 1;
        bVar7 = uVar4 <= uVar5;
      } while (uVar5 != uVar4);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Counter::_CompareStringToBuffer(std::vector<char>& buffer, std::string& compare, const size_t& start)
{
    // check if the first character matches, and if not we can already say that the string doesn't match
    if (buffer[start] != compare[0])
    {
        return false;
    }

    for (size_t i = 1; i < compare.size(); i++)
    {
        char& compareChar = compare.at(i);

        if (_GetBufferLookahead(buffer, start + i) != compareChar)
        {
            return false; // the current character is not the same of that in the buffer, so no match
        }
    }

    return true;
}